

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

void Abc_SopComplementVar(char *pSop,int iVar)

{
  int iVar1;
  char *pcStack_20;
  int nVars;
  char *pCube;
  int iVar_local;
  char *pSop_local;
  
  iVar1 = Abc_SopGetVarNum(pSop);
  pcStack_20 = pSop;
  if (iVar1 <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                  ,0x27a,"void Abc_SopComplementVar(char *, int)");
  }
  for (; *pcStack_20 != '\0'; pcStack_20 = pcStack_20 + (iVar1 + 3)) {
    if (pcStack_20[iVar] == '0') {
      pcStack_20[iVar] = '1';
    }
    else if (pcStack_20[iVar] == '1') {
      pcStack_20[iVar] = '0';
    }
  }
  return;
}

Assistant:

void Abc_SopComplementVar( char * pSop, int iVar )
{
    char * pCube;
    int nVars = Abc_SopGetVarNum(pSop);
    assert( iVar < nVars );
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        if ( pCube[iVar] == '0' )
            pCube[iVar] = '1';
        else if ( pCube[iVar] == '1' )
            pCube[iVar] = '0';
    }
}